

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O2

char * __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection,
          char *a_pKey,char *a_pDefault,bool *a_pHasMultiple)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  _Base_ptr p_Var4;
  key_type local_48;
  
  if (a_pHasMultiple != (bool *)0x0) {
    *a_pHasMultiple = false;
  }
  if (a_pKey != (char *)0x0 && a_pSection != (char *)0x0) {
    local_48.pComment = (char *)0x0;
    local_48.nOrder = 0;
    local_48.pItem = a_pSection;
    cVar2 = std::
            _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
            ::find(&(this->m_data)._M_t,&local_48);
    if ((_Rb_tree_header *)cVar2._M_node != &(this->m_data)._M_t._M_impl.super__Rb_tree_header) {
      local_48.pComment = (char *)0x0;
      local_48.nOrder = 0;
      local_48.pItem = a_pKey;
      cVar3 = std::
              _Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
              ::find((_Rb_tree<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>,_std::_Select1st<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                      *)&cVar2._M_node[1]._M_right,&local_48);
      if (cVar3._M_node != cVar2._M_node + 2) {
        if ((a_pHasMultiple != (bool *)0x0) && (this->m_bAllowMultiKey != false)) {
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(cVar3._M_node);
          if (p_Var4 != cVar2._M_node + 2) {
            bVar1 = SI_GenericNoCase<char>::operator()
                              ((SI_GenericNoCase<char> *)
                               &CSimpleIniTempl<char,SI_GenericNoCase<char>,SI_ConvertA<char>>::
                                IsLess(char_const*,char_const*)::isLess,a_pKey,
                               *(char **)(p_Var4 + 1));
            if (!bVar1) {
              *a_pHasMultiple = true;
            }
          }
        }
        a_pDefault = (char *)cVar3._M_node[1]._M_right;
      }
    }
  }
  return (char *)(_Base_ptr)a_pDefault;
}

Assistant:

const SI_CHAR *CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetValue(const SI_CHAR *a_pSection,
																			const SI_CHAR *a_pKey,
																			const SI_CHAR *a_pDefault,
																			bool *a_pHasMultiple) const {
	if (a_pHasMultiple) {
		*a_pHasMultiple = false;
	}
	if (!a_pSection || !a_pKey) {
		return a_pDefault;
	}
	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return a_pDefault;
	}
	typename TKeyVal::const_iterator iKeyVal = iSection->second.find(a_pKey);
	if (iKeyVal == iSection->second.end()) {
		return a_pDefault;
	}

	// check for multiple entries with the same key
	if (m_bAllowMultiKey && a_pHasMultiple) {
		typename TKeyVal::const_iterator iTemp = iKeyVal;
		if (++iTemp != iSection->second.end()) {
			if (!IsLess(a_pKey, iTemp->first.pItem)) {
				*a_pHasMultiple = true;
			}
		}
	}

	return iKeyVal->second;
}